

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O0

int __thiscall sznet::CountDownLatch::getCount(CountDownLatch *this)

{
  int iVar1;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  CountDownLatch *this_local;
  
  lock.m_mutex = (MutexLock *)this;
  MutexLockGuard::MutexLockGuard(&local_18,&this->m_mutex);
  iVar1 = this->m_count;
  MutexLockGuard::~MutexLockGuard(&local_18);
  return iVar1;
}

Assistant:

int CountDownLatch::getCount() const
{
	MutexLockGuard lock(m_mutex);
	return m_count;
}